

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osportable.cc
# Opt level: O2

int os_resolve_symlink(char *fname,char *target,size_t target_size)

{
  int iVar1;
  ssize_t sVar2;
  ulong __len;
  int iVar3;
  stat buf;
  
  iVar1 = lstat(fname,(stat *)&buf);
  iVar3 = 0;
  if ((iVar1 == 0) && ((buf.st_mode._1_1_ & 0xa0) != 0)) {
    __len = target_size - 1;
    if ((ulong)buf.st_size < target_size - 1) {
      __len = buf.st_size;
    }
    sVar2 = readlink(fname,target,__len);
    iVar3 = 0;
    if (-1 < sVar2) {
      target[__len] = '\0';
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int
os_resolve_symlink( const char *fname, char *target, size_t target_size )
{
    // get the stat() information for the *undereferenced* link; if
    // it's not actually a link, there's nothing to resolve
    struct stat buf;
    if (lstat(fname, &buf) != 0 or (buf.st_mode & S_IFLNK) == 0)
        return false;

    // read the link contents (maxing out at the buffer size)
    size_t copylen = (size_t)buf.st_size;
    if (copylen > target_size - 1)
        copylen = target_size - 1;
    if (readlink(fname, target, copylen) < 0)
        return false;

    // null-terminate the result and return success
    target[copylen] = '\0';
    return true;
}